

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

uint32_t __thiscall kratos::PackedStruct::bitwidth(PackedStruct *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference this_00;
  PackedStructFieldDef *def;
  const_iterator __end1;
  const_iterator __begin1;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range1;
  uint32_t result;
  PackedStruct *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ::begin(&this->attributes);
  def = (PackedStructFieldDef *)
        std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
        end(&this->attributes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                *)&def);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
              ::operator*(&__end1);
    uVar2 = PackedStructFieldDef::bitwidth(this_00);
    __range1._4_4_ = uVar2 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

uint32_t PackedStruct::bitwidth() const {
    uint32_t result = 0;
    for (auto const &def : attributes) {
        result += def.bitwidth();
    }
    return result;
}